

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O3

void __thiscall
t_go_generator::generate_countsetfields_helper
          (t_go_generator *this,ostream *out,t_struct *tstruct,string *tstruct_name,bool is_result)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  t_type *ptVar6;
  pointer pptVar7;
  string field_name;
  string escaped_tstruct_name;
  string local_a0;
  string local_80;
  t_struct *local_60;
  string *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_60 = tstruct;
  iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  (*(this->super_t_generator)._vptr_t_generator[3])(local_50,this,CONCAT44(extraout_var,iVar4));
  t_generator::indent_abi_cxx11_(&local_a0,&this->super_t_generator);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"func (p *",9);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(tstruct_name->_M_dataplus)._M_p,tstruct_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,") CountSetFields",0x10);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(tstruct_name->_M_dataplus)._M_p,tstruct_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"() int {",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_a0,&this->super_t_generator);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"count := 0",10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  pptVar7 = (local_60->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar7 !=
      (local_60->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_58 = &(this->super_t_generator).service_name_;
    paVar2 = &local_80.field_2;
    do {
      if ((*pptVar7)->req_ != T_REQUIRED) {
        ptVar6 = t_type::get_true_type((*pptVar7)->type_);
        bVar3 = is_pointer_field(*pptVar7,false);
        if (!bVar3) {
          iVar4 = (*(ptVar6->super_t_doc)._vptr_t_doc[0x10])(ptVar6);
          if ((char)iVar4 == '\0') {
            iVar4 = (*(ptVar6->super_t_doc)._vptr_t_doc[0xf])(ptVar6);
            if ((char)iVar4 == '\0') {
              iVar4 = (*(ptVar6->super_t_doc)._vptr_t_doc[0xe])(ptVar6);
              if ((char)iVar4 == '\0') {
                iVar4 = (*(ptVar6->super_t_doc)._vptr_t_doc[7])(ptVar6);
                if ((char)iVar4 == '\0') goto LAB_001fb972;
              }
            }
          }
        }
        (*(this->super_t_generator)._vptr_t_generator[3])(&local_80,this,&(*pptVar7)->name_);
        publicize(&local_a0,this,&local_80,false,local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        t_generator::indent_abi_cxx11_(&local_80,&this->super_t_generator);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_80._M_dataplus._M_p,local_80._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if (p.IsSet",0xb);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_a0._M_dataplus._M_p,local_a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"()) {",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + 1;
        t_generator::indent_abi_cxx11_(&local_80,&this->super_t_generator);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_80._M_dataplus._M_p,local_80._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"count++",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + -1;
        t_generator::indent_abi_cxx11_(&local_80,&this->super_t_generator);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_80._M_dataplus._M_p,local_80._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
      }
LAB_001fb972:
      pptVar7 = pptVar7 + 1;
    } while (pptVar7 !=
             (local_60->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  t_generator::indent_abi_cxx11_(&local_a0,&this->super_t_generator);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"return count",0xc);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_a0,&this->super_t_generator);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return;
}

Assistant:

void t_go_generator::generate_countsetfields_helper(ostream& out,
                                                    t_struct* tstruct,
                                                    const string& tstruct_name,
                                                    bool is_result) {
  (void)is_result;
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  const string escaped_tstruct_name(escape_string(tstruct->get_name()));

  out << indent() << "func (p *" << tstruct_name << ") CountSetFields" << tstruct_name << "() int {"
      << endl;
  indent_up();
  out << indent() << "count := 0" << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED)
      continue;

    t_type* type = (*f_iter)->get_type()->get_true_type();

    if (!(is_pointer_field(*f_iter) || type->is_map() || type->is_set() || type->is_list() || type->is_binary()))
      continue;

    const string field_name(publicize(escape_string((*f_iter)->get_name())));

    out << indent() << "if (p.IsSet" << field_name << "()) {" << endl;
    indent_up();
    out << indent() << "count++" << endl;
    indent_down();
    out << indent() << "}" << endl;
  }

  out << indent() << "return count" << endl << endl;
  indent_down();
  out << indent() << "}" << endl << endl;
}